

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall GrcManager::DebugGlyphAttributes(GrcManager *this,char *pchOutputPath)

{
  GrcSymbolTable *pGVar1;
  GrcSymbolTableEntry *pGVar2;
  size_t __n;
  uint uVar3;
  int iVar4;
  Symbol pGVar5;
  pointer ppGVar6;
  ostream *poVar7;
  char *pcVar8;
  long lVar9;
  pointer pbVar10;
  int nAttrID;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  size_t cpass;
  int ipassBidi;
  string staOutputFilename;
  size_t cpassJust;
  size_t cpassPos;
  size_t cpassSub;
  size_t cpassLB;
  ofstream strmOut;
  int local_3c4;
  undefined1 local_3c0 [32];
  uint local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  pointer local_390;
  ulong local_388;
  pointer local_380;
  long *local_378;
  size_t local_370;
  long local_368 [2];
  int local_354;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  long *local_290 [2];
  long local_280 [2];
  string local_270;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  size_t local_238;
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)local_290,pchOutputPath,(allocator *)local_230);
  std::__cxx11::string::append((char *)local_290);
  std::ofstream::ofstream(local_230);
  std::ofstream::open(local_230,(_Ios_Openmode)local_290[0]);
  if ((abStack_210[(long)*(_func_int **)(local_230._0_8_ + -0x18)] & 5) == 0) {
    pGVar1 = this->m_psymtbl;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"breakweight","");
    pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    local_398 = pGVar5->m_nInternalID;
    pGVar1 = this->m_psymtbl;
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"*skipPasses*","");
    pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_394 = pGVar5->m_nInternalID;
    pGVar1 = this->m_psymtbl;
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"*skipPasses2*","");
    pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if (pGVar5 == (Symbol)0x0) {
      local_3c4 = 0;
    }
    else {
      local_3c4 = pGVar5->m_nInternalID;
    }
    GdlRenderer::CountPasses
              (this->m_prndr,(size_t *)local_3c0,&local_238,&local_240,&local_250,&local_248,
               &local_354);
    local_390 = (pointer)local_3c0._0_8_;
    pGVar1 = this->m_psymtbl;
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"justify","");
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"stretch","");
    GrcStructName::GrcStructName((GrcStructName *)local_3c0,&local_330,&local_350);
    pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,(GrcStructName *)local_3c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if (g_errorList.m_fFatalError == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,"Fatal errors--compilation aborted",0x21);
    }
    else {
      local_39c = pGVar5->m_nInternalID;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,"GLYPH ATTRIBUTE IDS\n\n",0x15);
      ppGVar6 = (this->m_vpsymGlyphAttrs).
                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_vpsymGlyphAttrs).
          super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppGVar6) {
        uVar11 = 0;
        do {
          if ((int)uVar11 == ppGVar6[uVar11]->m_nInternalID) {
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
            GrcSymbolTableEntry::FullName_abi_cxx11_
                      ((string *)local_3c0,
                       (this->m_vpsymGlyphAttrs).
                       super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11]);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_3c0._0_8_,local_3c0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((pointer)local_3c0._0_8_ != (pointer)(local_3c0 + 0x10)) {
              operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
            }
          }
          uVar11 = uVar11 + 1;
          ppGVar6 = (this->m_vpsymGlyphAttrs).
                    super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar11 < (ulong)((long)(this->m_vpsymGlyphAttrs).
                                        super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar6
                                 >> 3));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,"\n\n\nGLYPH ATTRIBUTE VALUES\n\n",0x1b);
      if (this->m_cwGlyphIDs != 0) {
        local_380 = (pointer)0x10;
        if (local_390 < (pointer)0x10) {
          local_380 = local_390;
        }
        uVar11 = 0;
        do {
          uVar13 = uVar11 & 0xffff;
          ConvertBwForVersion(this,(gid16)uVar11,local_398);
          SplitLargeStretchValue(this,(gid16)uVar11,local_39c);
          if ((this->m_vpsymGlyphAttrs).
              super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (this->m_vpsymGlyphAttrs).
              super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar12 = 0;
            bVar14 = false;
            local_3a0 = (uint)uVar13;
            local_388 = uVar11;
            do {
              nAttrID = (int)uVar12;
              uVar3 = FinalAttrValue(this,(gid16)uVar13,nAttrID);
              if (uVar3 != 0) {
                if (!bVar14) {
                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  [",3);
                  DebugHex((ostream *)local_230,(gid16)local_3a0);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"]\n",2);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"   ",3);
                GrcSymbolTableEntry::FullName_abi_cxx11_
                          ((string *)local_3c0,
                           (this->m_vpsymGlyphAttrs).
                           super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar12]);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_230,(char *)local_3c0._0_8_,local_3c0._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
                if ((pointer)local_3c0._0_8_ != (pointer)(local_3c0 + 0x10)) {
                  operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
                }
                pGVar2 = (this->m_vpsymGlyphAttrs).
                         super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12];
                local_378 = local_368;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"gpoint","");
                __n = (pGVar2->m_staFieldName)._M_string_length;
                if (__n == local_370) {
                  if (__n == 0) {
                    bVar14 = true;
                  }
                  else {
                    iVar4 = bcmp((pGVar2->m_staFieldName)._M_dataplus._M_p,local_378,__n);
                    bVar14 = iVar4 == 0;
                  }
                }
                else {
                  bVar14 = false;
                }
                if (local_378 != local_368) {
                  operator_delete(local_378,local_368[0] + 1);
                }
                lVar9 = 4;
                pcVar8 = "zero";
                if ((bool)(uVar3 == 0xfffffffe & bVar14)) {
LAB_00115ed4:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,pcVar8,lVar9);
                }
                else {
                  std::ostream::operator<<((ostream *)local_230,uVar3);
                  if ((nAttrID == local_394) || (nAttrID == local_3c4)) {
                    pbVar10 = local_380;
                    if (nAttrID == local_3c4) {
                      pbVar10 = local_390;
                    }
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," [",2);
                    DebugHex((ostream *)local_230,(gid16)uVar3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_230,"  / ",4);
                    uVar11 = (ulong)(nAttrID == local_3c4);
                    pcVar8 = (char *)((long)pbVar10 + uVar11 * -0x10);
                    if ((pointer)(uVar11 * 0x10) <= pbVar10 && pcVar8 != (char *)0x0) {
                      do {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_230," ",1);
                        std::ostream::operator<<((ostream *)local_230,uVar3 & 1);
                        uVar3 = (int)uVar3 >> 1;
                        pcVar8 = pcVar8 + -1;
                      } while (pcVar8 != (char *)0x0);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"]",1);
                  }
                  else if (9 < uVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," [",2);
                    lVar9 = 1;
                    DebugHex((ostream *)local_230,(gid16)uVar3);
                    pcVar8 = "]";
                    goto LAB_00115ed4;
                  }
                }
                bVar14 = true;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
              }
              uVar11 = local_388;
              uVar12 = (ulong)(nAttrID + 1);
              uVar13 = (ulong)local_3a0;
            } while (uVar12 < (ulong)((long)(this->m_vpsymGlyphAttrs).
                                            super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_vpsymGlyphAttrs).
                                            super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
            if (bVar14) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n\n",2);
            }
          }
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (uVar11 < this->m_cwGlyphIDs);
      }
    }
    std::ofstream::close();
  }
  else {
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"Error in writing to file ","");
    std::__cxx11::string::string((string *)&local_270,(char *)local_290[0],(allocator *)local_3c0);
    GrcErrorList::AddItem
              (&g_errorList,false,0x1967,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_2b0,
               &local_270,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
               (string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  return;
}

Assistant:

void GrcManager::DebugGlyphAttributes(char * pchOutputPath)
{
	std::string staOutputFilename(pchOutputPath);
	staOutputFilename.append("/dbg_glyphattrs.txt");

	std::ofstream strmOut;
	strmOut.open(staOutputFilename.data());
	if (strmOut.fail())
	{
		g_errorList.AddWarning(6503, NULL,
			"Error in writing to file ", staOutputFilename.data());
		return;
	}

	Symbol psymBw = m_psymtbl->FindSymbol("breakweight");
	int nAttrIdBw = psymBw->InternalID();

	Symbol psymSkipP = m_psymtbl->FindSymbol("*skipPasses*");
	int nAttrIdSkipP = psymSkipP->InternalID();
	int nAttrIdSkipP2 = 0;
	Symbol psymSkipP2 = m_psymtbl->FindSymbol("*skipPasses2*");
	if (psymSkipP2)
		nAttrIdSkipP2 = psymSkipP2->InternalID();
	auto cpass = this->m_prndr->NumberOfPasses();

	//Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "0", "stretch"));
	Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "stretch"));
	int nAttrIdJStr = psymJStr->InternalID();

	if (g_errorList.AnyFatalErrors())
		strmOut << "Fatal errors--compilation aborted";
	else
	{
		strmOut << "GLYPH ATTRIBUTE IDS\n\n";
		for (size_t nAttrID = 0; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
		{
			if (m_vpsymGlyphAttrs[nAttrID]->InternalID() == static_cast<int>(nAttrID))
			{
				strmOut << nAttrID << ": "
					<< m_vpsymGlyphAttrs[nAttrID]->FullName() << "\n";
			}
			// else we have something like justify.stretch which is unused
		}
		strmOut << "\n\n\nGLYPH ATTRIBUTE VALUES\n\n";

		for (auto wGlyphID = 0U; wGlyphID < m_cwGlyphIDs; wGlyphID++)
		{
			// Convert breakweight values depending on the table version to output.
			ConvertBwForVersion(wGlyphID, nAttrIdBw);

			//	Split any large stretch values into two 16-bit words.
			SplitLargeStretchValue(wGlyphID, nAttrIdJStr);
		
			bool fAnyNonZero = false;

			for (auto nAttrID = 0U; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
			{
				int nValue = FinalAttrValue(wGlyphID, nAttrID);

				//	Skip undefined and zero-valued attributes.
				if (nValue == 0)
					continue;

				if (fAnyNonZero == false)
				{
					strmOut << wGlyphID << "  [";
					DebugHex(strmOut, wGlyphID);
					strmOut << "]\n";
				}

				fAnyNonZero = true;

				strmOut << "   " << m_vpsymGlyphAttrs[nAttrID]->FullName()
					<< " = ";
				if (m_vpsymGlyphAttrs[nAttrID]->LastFieldIs("gpoint") &&
					nValue == kGpointZero)
				{
					strmOut << "zero" << "\n";
				}
				else
				{
					strmOut  << nValue;
					if (nAttrID == nAttrIdSkipP || nAttrID == nAttrIdSkipP2)
					{
						size_t iStart = 0, 
							   iStop = cpass;
						if (cpass > kPassPerSPbitmap)
							iStop = kPassPerSPbitmap;
						if (nAttrID == nAttrIdSkipP2)
						{
							iStart = kPassPerSPbitmap;
							iStop = cpass;
						}

						strmOut << " [";
						DebugHex(strmOut, nValue);
						strmOut << "  / ";
						// Print out bits in order of passes (low to high).
						int tValue = nValue;
						for (auto ipass = iStart; ipass < iStop; ++ipass)
						{
							int n = int((tValue & 0x0001) != 0);
							strmOut << " " << n;
							tValue = tValue >> 1;
						}
						strmOut << "]";
					}
					else if (nValue > 9 || nValue < 0)
					{
						strmOut << " [";
						DebugHex(strmOut, nValue);
						strmOut << "]";
					}
					strmOut << "\n";
				}
			}

			if (fAnyNonZero)
				strmOut << "\n\n";
		}
	}

	strmOut.close();
}